

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O3

void duckdb::RemapStruct(Vector *input,Vector *default_vector,Vector *result,idx_t result_size,
                        vector<duckdb::RemapColumnInfo,_true> *remap_info)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  ulong uVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  _Head_base<0UL,_unsigned_long_*,_false> _Var7;
  pointer pRVar8;
  const_reference this_02;
  idx_t iVar9;
  reference pvVar10;
  type pVVar11;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar12;
  Vector *default_vector_00;
  type result_00;
  pointer pVVar13;
  InternalException *pIVar14;
  pointer pRVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  size_type __n;
  bool bVar17;
  UnifiedVectorFormat format;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  undefined1 local_78 [16];
  SelectionVector local_68 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = StructVector::GetEntries(input);
  this_01 = StructVector::GetEntries(result);
  pRVar8 = (remap_info->
           super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
           super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar15 = (remap_info->
            super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
            super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((long)(this_01->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this_01->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 !=
      ((long)pRVar15 - (long)pRVar8 >> 3) * -0x3333333333333333) {
    pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
    local_78._0_8_ = local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Remap info unaligned in remap struct","");
    InternalException::InternalException(pIVar14,(string *)local_78);
    __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      return;
    }
    bVar17 = false;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    Vector::ToUnifiedFormat(input,result_size,(UnifiedVectorFormat *)local_78);
    if ((unsigned_long *)local_68[0].sel_vector == (unsigned_long *)0x0) {
      bVar17 = false;
    }
    else {
      FlatVector::VerifyFlatVector(result);
      if (result_size != 0) {
        uVar16 = 0;
        do {
          uVar5 = uVar16;
          if (*(long *)local_78._0_8_ != 0) {
            uVar5 = (ulong)*(uint *)(*(long *)local_78._0_8_ + uVar16 * 4);
          }
          if (((unsigned_long *)local_68[0].sel_vector != (unsigned_long *)0x0) &&
             ((*(ulong *)((long)local_68[0].sel_vector + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) ==
              0)) {
            _Var7._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var7._M_head_impl == (unsigned_long *)0x0) {
              local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_98,&local_80);
              p_Var4 = p_Stack_90;
              peVar3 = local_98;
              local_98 = (element_type *)0x0;
              p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar3;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var4;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
              }
              pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                 (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                   validity_data);
              _Var7._M_head_impl =
                   (pTVar6->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var7._M_head_impl;
            }
            bVar2 = (byte)uVar16 & 0x3f;
            _Var7._M_head_impl[uVar16 >> 6] =
                 _Var7._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
          }
          uVar16 = uVar16 + 1;
        } while (result_size != uVar16);
      }
      bVar17 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
               (unsigned_long *)0x0;
    }
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (local_68[0].selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68[0].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    pRVar8 = (remap_info->
             super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pRVar15 = (remap_info->
              super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
              super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pRVar15 != pRVar8) {
    local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    __n = 0;
    do {
      this_02 = vector<duckdb::RemapColumnInfo,_true>::operator[](remap_info,__n);
      if (((this_02->index).index == 0xffffffffffffffff) ||
         ((this_02->child_remap_info).
          super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
          super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this_02->child_remap_info).
          super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
          super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        if ((this_02->default_index).index == 0xffffffffffffffff) {
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_01,__n);
          pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->(pvVar10);
          iVar9 = optional_idx::GetIndex(&this_02->index);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_00,iVar9);
          pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar10);
          Vector::Reference(pVVar13,pVVar11);
        }
        else {
          pvVar12 = StructVector::GetEntries(default_vector);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_01,__n);
          pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->(pvVar10);
          iVar9 = optional_idx::GetIndex(&this_02->default_index);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](pvVar12,iVar9);
          pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar10);
          Vector::Reference(pVVar13,pVVar11);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_01,__n);
          pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->(pvVar10);
          if (pVVar13->vector_type != CONSTANT_VECTOR) {
            pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
            local_78._0_8_ = local_68;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_78,"Default value in remap struct must be a constant","");
            InternalException::InternalException(pIVar14,(string *)local_78);
            __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar17) {
            pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[](this_01,__n);
            pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar10);
            puVar1 = (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
              pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_01,__n);
              pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator->(pvVar10);
              Vector::Flatten(pVVar13,result_size);
              pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_01,__n);
              pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar10);
              FlatVector::VerifyFlatVector(result);
              FlatVector::VerifyFlatVector(pVVar11);
              (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                        (&(pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_data,local_88);
              (pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            }
          }
        }
      }
      else {
        iVar9 = optional_idx::GetIndex(&this_02->index);
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_00,iVar9);
        pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar10);
        default_vector_00 = default_vector;
        if ((this_02->default_index).index != 0xffffffffffffffff) {
          pvVar12 = StructVector::GetEntries(default_vector);
          iVar9 = optional_idx::GetIndex(&this_02->default_index);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](pvVar12,iVar9);
          default_vector_00 =
               unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar10);
        }
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_01,__n);
        result_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar10);
        RemapStruct(pVVar11,default_vector_00,result_00,result_size,&this_02->child_remap_info);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(remap_info->
                                  super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                                  ).
                                  super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(remap_info->
                                  super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                                  ).
                                  super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x3333333333333333));
  }
  return;
}

Assistant:

static void RemapStruct(Vector &input, Vector &default_vector, Vector &result, idx_t result_size,
                        const vector<RemapColumnInfo> &remap_info) {
	auto &input_vectors = StructVector::GetEntries(input);
	auto &result_vectors = StructVector::GetEntries(result);
	if (result_vectors.size() != remap_info.size()) {
		throw InternalException("Remap info unaligned in remap struct");
	}
	bool has_top_level_null = false;
	// copy over the NULL values from the input vector
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(input)) {
			ConstantVector::SetNull(result, true);
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			return;
		}
	} else {
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(result_size, format);
		if (!format.validity.AllValid()) {
			auto &result_validity = FlatVector::Validity(result);
			for (idx_t i = 0; i < result_size; i++) {
				auto input_idx = format.sel->get_index(i);
				if (!format.validity.RowIsValid(input_idx)) {
					result_validity.SetInvalid(i);
				}
			}
			has_top_level_null = !result_validity.AllValid();
		}
	}
	// set up the correct vector references
	for (idx_t i = 0; i < remap_info.size(); i++) {
		auto &remap = remap_info[i];
		if (remap.index.IsValid() && !remap.child_remap_info.empty()) {
			// nested remap - recurse
			auto &input_vector = *input_vectors[remap.index.GetIndex()];
			reference<Vector> child_default = default_vector;
			if (remap.default_index.IsValid()) {
				auto &defaults = StructVector::GetEntries(default_vector);
				child_default = *defaults[remap.default_index.GetIndex()];
			}
			RemapStruct(input_vector, child_default.get(), *result_vectors[i], result_size, remap.child_remap_info);
			continue;
		}
		// root remap
		if (remap.default_index.IsValid()) {
			auto &defaults = StructVector::GetEntries(default_vector);
			result_vectors[i]->Reference(*defaults[remap.default_index.GetIndex()]);
			if (result_vectors[i]->GetVectorType() != VectorType::CONSTANT_VECTOR) {
				throw InternalException("Default value in remap struct must be a constant");
			}
			if (has_top_level_null && !ConstantVector::IsNull(*result_vectors[i])) {
				// if we have any top-level NULL values and the default value is not NULL, we need to propagate the NULL
				// values to the default value
				result_vectors[i]->Flatten(result_size);
				FlatVector::SetValidity(*result_vectors[i], FlatVector::Validity(result));
			}
		} else {
			result_vectors[i]->Reference(*input_vectors[remap.index.GetIndex()]);
		}
	}
}